

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

bool MallocBlock::CheckEverything(void)

{
  SpinLock SVar1;
  bool bVar2;
  FunctionRef<void_(const_void_*,_int_*)> body;
  undefined1 local_11;
  
  LOCK();
  bVar2 = (__atomic_base<int>)alloc_map_lock_.lockword_.super___atomic_base<int>._M_i ==
          (__atomic_base<int>)0x0;
  if (bVar2) {
    alloc_map_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x1;
  }
  UNLOCK();
  if (!bVar2) {
    SpinLock::SlowLock(&alloc_map_lock_);
  }
  if (alloc_map_ != (AllocMap *)0x0) {
    body.data = &local_11;
    body.fn = anon_func::anon_class_1_0_00000001::__invoke;
    AddressMap<int>::Iterate(alloc_map_,body);
  }
  SVar1.lockword_.super___atomic_base<int>._M_i =
       alloc_map_lock_.lockword_.super___atomic_base<int>._M_i;
  LOCK();
  alloc_map_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x0;
  UNLOCK();
  if ((__atomic_base<int>)SVar1.lockword_.super___atomic_base<int>._M_i != (__atomic_base<int>)0x1)
  {
    SpinLock::SlowUnlock(&alloc_map_lock_);
  }
  return true;
}

Assistant:

static bool CheckEverything() {
    alloc_map_lock_.Lock();
    if (alloc_map_) {
      alloc_map_->Iterate([] (const void* ptr, int* type) {
        if ((*type & kDeallocatedTypeBit) == 0) {
          FromRawPointer(ptr)->CheckLocked(*type);
        }
      });
    }
    alloc_map_lock_.Unlock();
    return true;  // if we get here, we're okay
  }